

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::CleanupImpl(cmCTestSVN *this)

{
  undefined1 local_c0 [8];
  OutputLogger err;
  OutputLogger out;
  char *local_30;
  undefined1 local_28 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> svn_cleanup;
  cmCTestSVN *this_local;
  
  svn_cleanup.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  local_30 = "cleanup";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,&local_30);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"cleanup-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_c0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "cleanup-err> ");
  RunSVNCommand(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_28,
                (OutputParser *)&err.super_LineParser.Separator,(OutputParser *)local_c0);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_c0);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)&err.super_LineParser.Separator);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_28);
  return;
}

Assistant:

void cmCTestSVN::CleanupImpl()
{
  std::vector<const char*> svn_cleanup;
  svn_cleanup.push_back("cleanup");
  OutputLogger out(this->Log, "cleanup-out> ");
  OutputLogger err(this->Log, "cleanup-err> ");
  this->RunSVNCommand(svn_cleanup, &out, &err);
}